

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_binder.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::OrderBinder::BindConstant(OrderBinder *this,ParsedExpression *expr)

{
  idx_t value;
  __uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
  this_00;
  pointer pBVar1;
  ParsedExpression *in_RDX;
  child_list_t<Value> values;
  optional_idx index;
  allocator local_149;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_148;
  optional_idx local_130;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_128;
  Value local_108;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_c8;
  char *local_68;
  Value local_60;
  
  local_130 = TryGetProjectionReference((OrderBinder *)expr,in_RDX);
  if (local_130.index == 0xffffffffffffffff) {
    (this->binders).
    super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    local_148.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value = optional_idx::GetIndex(&local_130);
    Value::UBIGINT(&local_108,value);
    local_68 = "index";
    Value::Value(&local_60,&local_108);
    ::std::__cxx11::string::string((string *)&local_c8,local_68,&local_149);
    Value::Value(&local_c8.second,&local_60);
    ::std::
    vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
    ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
              ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                *)&local_148,&local_c8);
    Value::~Value(&local_c8.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
      operator_delete(local_c8.first._M_dataplus._M_p);
    }
    Value::~Value(&local_60);
    Value::~Value(&local_108);
    local_128.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_148.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_128.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_148.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_128.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_148.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::STRUCT((Value *)&local_68,(child_list_t<Value> *)&local_128);
    this_00._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
    .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl =
         (tuple<duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
          )operator_new(0x98);
    Value::Value((Value *)&local_c8,(Value *)&local_68);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)
               this_00._M_t.
               super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
               .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl,
               (Value *)&local_c8);
    local_108.type_._0_8_ =
         this_00._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
         .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl;
    Value::~Value((Value *)&local_c8);
    Value::~Value((Value *)&local_68);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_128);
    pBVar1 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                           *)&local_108);
    ::std::__cxx11::string::_M_assign
              ((string *)&(pBVar1->super_Expression).super_BaseExpression.alias);
    pBVar1 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                           *)&local_108);
    (pBVar1->super_Expression).super_BaseExpression.query_location.index =
         (in_RDX->super_BaseExpression).query_location.index;
    (this->binders).
    super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108.type_._0_8_;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_148);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> OrderBinder::BindConstant(ParsedExpression &expr) {
	auto index = TryGetProjectionReference(expr);
	if (!index.IsValid()) {
		return nullptr;
	}
	child_list_t<Value> values;
	values.push_back(make_pair("index", Value::UBIGINT(index.GetIndex())));
	auto result = make_uniq<BoundConstantExpression>(Value::STRUCT(std::move(values)));
	result->SetAlias(expr.GetAlias());
	result->SetQueryLocation(expr.GetQueryLocation());
	return std::move(result);
}